

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<short,short,short,duckdb::BinaryNumericDivideWrapper,duckdb::DivideOperator,bool>
               (short *ldata,short *rdata,short *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  short sVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t i;
  idx_t iVar5;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar3 = iVar5;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)lsel->sel_vector[iVar5];
      }
      iVar4 = iVar5;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)rsel->sel_vector[iVar5];
      }
      sVar2 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,short,short,short>
                        (fun,ldata[iVar3],rdata[iVar4],result_validity,iVar5);
      result_data[iVar5] = sVar2;
    }
  }
  else {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar3 = iVar5;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)lsel->sel_vector[iVar5];
      }
      iVar4 = iVar5;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)rsel->sel_vector[iVar5];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,iVar3);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,iVar4);
        if (!bVar1) goto LAB_0182b7df;
        sVar2 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,short,short,short>
                          (fun,ldata[iVar3],rdata[iVar4],result_validity,iVar5);
        result_data[iVar5] = sVar2;
      }
      else {
LAB_0182b7df:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,iVar5);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}